

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# i2cp.c
# Opt level: O0

void i2cp_offer(i2cp_state *state,uint8_t *data,ssize_t sz)

{
  int iVar1;
  uint32_t uVar2;
  uint8_t *in_RDX;
  i2cp_state *in_RSI;
  long in_RDI;
  ssize_t diff;
  uint32_t curlen;
  undefined8 in_stack_ffffffffffffffd8;
  uint32_t sz_00;
  undefined4 in_stack_ffffffffffffffe0;
  
  sz_00 = (uint32_t)((ulong)in_stack_ffffffffffffffd8 >> 0x20);
  if (in_RDX == (uint8_t *)0x0) {
    i2cp_flush_read((i2cp_state *)0x106795);
  }
  else if ((-1 < (long)in_RDX) && (in_RDX + *(uint *)(in_RDI + 0x1018) < (uint8_t *)0x10000)) {
    memcpy((void *)(in_RDI + 0x101c + (ulong)*(uint *)(in_RDI + 0x1018)),in_RSI,(size_t)in_RDX);
    *(int *)(in_RDI + 0x1018) = *(int *)(in_RDI + 0x1018) + (int)in_RDX;
    if ((4 < *(uint *)(in_RDI + 0x1018)) &&
       (uVar2 = bufbe32toh((void *)0x106835), uVar2 + 5 <= *(uint *)(in_RDI + 0x1018))) {
      i2cp_ringbuf_append((i2cp_ringbuf *)in_RSI,(uint8_t)((ulong)in_RDX >> 0x38),
                          (uint8_t *)CONCAT44(uVar2,in_stack_ffffffffffffffe0),sz_00);
      iVar1 = *(int *)(in_RDI + 0x1018);
      *(undefined4 *)(in_RDI + 0x1018) = 0;
      if (iVar1 != uVar2 + 5) {
        i2cp_offer(in_RSI,in_RDX,CONCAT44(uVar2,in_stack_ffffffffffffffe0));
      }
    }
  }
  return;
}

Assistant:

void i2cp_offer(struct i2cp_state * state, uint8_t * data, ssize_t sz)
{
  if(sz == 0)
  {
    i2cp_flush_read(state);
    return;
  }
  if(sz < 0) return;
  
  if(sizeof(state->readcur.buf) <= state->readcur.sz + sz)
  {
    return;
  }
  memcpy(state->readcur.buf + state->readcur.sz, data, sz);
  state->readcur.sz += sz;
  

  if(state->readcur.sz > 4)
  {
    uint32_t curlen = bufbe32toh(state->readcur.buf);
    if( curlen + 5 <= state->readcur.sz)
    {
      i2cp_ringbuf_append(&state->readbuf, state->readcur.buf[4], state->readcur.buf + 5, curlen);
      ssize_t diff = state->readcur.sz - (curlen + 5);
      state->readcur.sz = 0;
      if(diff > 0)
        i2cp_offer(state, state->readcur.buf + diff, diff);
    }
  }
}